

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::ScatterAlongAxisLayerParams::MergePartialFromCodedStream
          (ScatterAlongAxisLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  ulong uVar6;
  int value;
  int local_2c;
  
LAB_001c850a:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001c852d;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001c852d:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) {
LAB_001c8592:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar6 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar6 != '\x10') goto LAB_001c8592;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&local_2c);
        if (!bVar3) {
          return false;
        }
        this->mode_ = local_2c;
        goto LAB_001c850a;
      }
      if ((uVar5 != 1) || ((char)uVar6 != '\b')) goto LAB_001c8592;
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&this->axis_);
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ScatterAlongAxisLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ScatterAlongAxisLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ScatterMode mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_mode(static_cast< ::CoreML::Specification::ScatterMode >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ScatterAlongAxisLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ScatterAlongAxisLayerParams)
  return false;
#undef DO_
}